

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

int AF_APlayerPawn_GetMaxHealth
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  APlayerPawn *this;
  int val;
  bool bVar1;
  bool local_47;
  int u;
  APlayerPawn *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                  ,0x4c8,
                  "int AF_APlayerPawn_GetMaxHealth(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar1) {
    this = (APlayerPawn *)(param->field_0).field_1.a;
    local_47 = true;
    if (this != (APlayerPawn *)0x0) {
      local_47 = DObject::IsKindOf((DObject *)this,APlayerPawn::RegistrationInfo.MyClass);
    }
    if (local_47 != false) {
      val = APlayerPawn::GetMaxHealth(this);
      if (numret < 1) {
        param_local._4_4_ = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                        ,0x4c9,
                        "int AF_APlayerPawn_GetMaxHealth(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        VMReturn::SetInt(ret,val);
        param_local._4_4_ = 1;
      }
      return param_local._4_4_;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(APlayerPawn))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                  ,0x4c8,
                  "int AF_APlayerPawn_GetMaxHealth(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                ,0x4c8,
                "int AF_APlayerPawn_GetMaxHealth(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(APlayerPawn, GetMaxHealth)
{
	PARAM_SELF_PROLOGUE(APlayerPawn);
	ACTION_RETURN_INT(self->GetMaxHealth());
}